

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

Real NormHelper_NVector_MultiFab(N_Vector x,N_Vector w,N_Vector id,int use_id,bool rms)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Real RVar20;
  MFIter mfi;
  double local_228;
  FabArray<amrex::FArrayBox> *local_1c0;
  Box local_1a8;
  ulong local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  IntVect local_160;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  if (use_id == 0) {
    local_1c0 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_1c0 = *(FabArray<amrex::FArrayBox> **)((long)id->content + 8);
  }
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)w->content + 8);
  uVar3 = (this->super_FabArrayBase).n_comp;
  iVar4 = *x->content;
  if (use_id == 0) {
    local_1a8.smallend.vect[0] = 0;
    local_1a8.smallend.vect[1] = 0;
    local_1a8.smallend.vect[2] = 0;
    amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,true);
    local_228 = 0.0;
    if (local_90.currentIndex < local_90.endIndex) {
      local_228 = 0.0;
      do {
        amrex::MFIter::growntilebox((Box *)&local_d0,&local_90,&local_1a8.smallend);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,this,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,this_00,&local_90);
        if (0 < (int)uVar3) {
          lVar11 = (long)(int)local_d0.jstride;
          lVar10 = (long)local_d0.p._4_4_;
          lVar7 = (lVar10 - local_150.begin.y) * local_150.jstride * 8 +
                  (lVar11 - local_150.begin.z) * local_150.kstride * 8 + (long)(int)local_d0.p * 8 +
                  (long)local_150.begin.x * -8 + (long)local_150.p;
          lVar9 = (lVar10 - local_110.begin.y) * local_110.jstride * 8 +
                  (lVar11 - local_110.begin.z) * local_110.kstride * 8 + (long)(int)local_d0.p * 8 +
                  (long)local_110.begin.x * -8 + (long)local_110.p;
          uVar5 = 0;
          do {
            lVar12 = lVar7;
            lVar18 = lVar9;
            lVar8 = lVar11;
            if ((int)local_d0.jstride <= local_d0.kstride._4_4_) {
              do {
                lVar14 = lVar18;
                lVar16 = lVar10;
                lVar6 = lVar12;
                if (local_d0.p._4_4_ <= (int)local_d0.kstride) {
                  do {
                    if ((int)local_d0.p <= local_d0.jstride._4_4_) {
                      lVar13 = 0;
                      do {
                        dVar1 = *(double *)(lVar14 + lVar13 * 8);
                        dVar2 = *(double *)(lVar6 + lVar13 * 8);
                        local_228 = local_228 + dVar1 * dVar1 * dVar2 * dVar2;
                        lVar13 = lVar13 + 1;
                      } while ((local_d0.jstride._4_4_ - (int)local_d0.p) + 1 != (int)lVar13);
                    }
                    lVar16 = lVar16 + 1;
                    lVar6 = lVar6 + local_150.jstride * 8;
                    lVar14 = lVar14 + local_110.jstride * 8;
                  } while ((int)local_d0.kstride + 1 != (int)lVar16);
                }
                lVar8 = lVar8 + 1;
                lVar12 = lVar12 + local_150.kstride * 8;
                lVar18 = lVar18 + local_110.kstride * 8;
              } while (local_d0.kstride._4_4_ + 1 != (int)lVar8);
            }
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + local_150.nstride * 8;
            lVar9 = lVar9 + local_110.nstride * 8;
          } while (uVar5 != uVar3);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
  }
  else {
    local_160.vect[0] = 0;
    local_160.vect[1] = 0;
    local_160.vect[2] = 0;
    amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,true);
    local_228 = 0.0;
    if (local_90.currentIndex < local_90.endIndex) {
      local_228 = 0.0;
      do {
        amrex::MFIter::growntilebox(&local_1a8,&local_90,&local_160);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,this,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,this_00,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_d0,local_1c0,&local_90);
        if (0 < (int)uVar3) {
          local_168 = (long)local_1a8.smallend.vect[2];
          lVar9 = (long)local_1a8.smallend.vect[1];
          lVar10 = (long)local_1a8.smallend.vect[0];
          lVar12 = CONCAT44(local_d0.kstride._4_4_,(int)local_d0.kstride) * 8;
          lVar11 = CONCAT44(local_d0.jstride._4_4_,(int)local_d0.jstride) * 8;
          lVar18 = (lVar9 - local_150.begin.y) * local_150.jstride * 8 +
                   (local_168 - local_150.begin.z) * local_150.kstride * 8 + lVar10 * 8 +
                   (long)local_150.begin.x * -8 + (long)local_150.p;
          lVar7 = (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
                  (local_168 - local_110.begin.z) * local_110.kstride * 8 + lVar10 * 8 +
                  (long)local_110.begin.x * -8 + (long)local_110.p;
          local_180 = local_150.nstride * 8;
          local_170 = local_110.nstride * 8;
          local_178 = (lVar9 - local_d0.begin.y) * lVar11 + (local_168 - local_d0.begin.z) * lVar12
                      + lVar10 * 8 + (long)local_d0.begin.x * -8 +
                      CONCAT44(local_d0.p._4_4_,(int)local_d0.p);
          local_188 = (ulong)(uint)local_1a8.bigend.vect[2];
          uVar5 = 0;
          do {
            lVar10 = lVar18;
            lVar8 = local_168;
            lVar14 = local_178;
            lVar16 = lVar7;
            if (local_1a8.smallend.vect[2] <= local_1a8.bigend.vect[2]) {
              do {
                lVar6 = lVar9;
                lVar13 = lVar10;
                lVar15 = lVar16;
                lVar19 = lVar14;
                if (local_1a8.smallend.vect[1] <= local_1a8.bigend.vect[1]) {
                  do {
                    if (local_1a8.smallend.vect[0] <= local_1a8.bigend.vect[0]) {
                      lVar17 = 0;
                      do {
                        if (0.0 < *(double *)(lVar19 + lVar17 * 8)) {
                          dVar1 = *(double *)(lVar15 + lVar17 * 8);
                          dVar2 = *(double *)(lVar13 + lVar17 * 8);
                          local_228 = local_228 + dVar1 * dVar1 * dVar2 * dVar2;
                        }
                        lVar17 = lVar17 + 1;
                      } while ((local_1a8.bigend.vect[0] - local_1a8.smallend.vect[0]) + 1 !=
                               (int)lVar17);
                    }
                    lVar6 = lVar6 + 1;
                    lVar13 = lVar13 + local_150.jstride * 8;
                    lVar15 = lVar15 + local_110.jstride * 8;
                    lVar19 = lVar19 + lVar11;
                  } while (local_1a8.bigend.vect[1] + 1 != (int)lVar6);
                }
                lVar8 = lVar8 + 1;
                lVar10 = lVar10 + local_150.kstride * 8;
                lVar16 = lVar16 + local_110.kstride * 8;
                lVar14 = lVar14 + lVar12;
              } while (local_1a8.bigend.vect[2] + 1U != (int)lVar8);
            }
            uVar5 = uVar5 + 1;
            lVar18 = lVar18 + local_180;
            lVar7 = lVar7 + local_170;
          } while (uVar5 != uVar3);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
  }
  amrex::MFIter::~MFIter(&local_90);
  if (rms) {
    local_228 = local_228 / (double)iVar4;
  }
  RVar20 = 0.0;
  if (0.0 < local_228) {
    if (local_228 < 0.0) {
      RVar20 = sqrt(local_228);
    }
    else {
      RVar20 = SQRT(local_228);
    }
  }
  return RVar20;
}

Assistant:

amrex::Real NormHelper_NVector_MultiFab(N_Vector x, N_Vector w, N_Vector id, int use_id, bool rms)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    //Call mf_y=mf_w is the MultiFab* from the N_Vector w
    MultiFab *mf_y = amrex::sundials::getMFptr(w);
    MultiFab *mf_id = use_id ? amrex::sundials::getMFptr(id) : NULL;
    sunindextype numcomp = mf_x->nComp();
    sunindextype N = amrex::sundials::N_VGetLength_MultiFab(x);
    bool local = true;
    IntVect nghost = amrex::IntVect::TheZeroVector();
    Real sum = 0;
    int xcomp = 0;
    int ycomp = 0;

    // ghost cells not included
    if(use_id)
        sum = amrex::NormHelper(*mf_id,
                                *mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real m) -> amrex::Real { return m > amrex::Real(0.0); },
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    else
        sum = amrex::NormHelper(*mf_x, xcomp,
                                *mf_y, ycomp,
                                [=] AMREX_GPU_HOST_DEVICE (amrex::Real x, amrex::Real y) -> amrex::Real { return x*x*y*y; },
                                numcomp, nghost, local);
    ParallelDescriptor::ReduceRealSum(sum);

    return rms ? SUNRsqrt(sum/N) : SUNRsqrt(sum);
}